

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

char * __thiscall cmGeneratorTarget::GetLocationForBuild(cmGeneratorTarget *this)

{
  cmTarget *this_00;
  cmMakefile *this_01;
  bool bVar1;
  int iVar2;
  char *__s1;
  ulong uVar3;
  allocator local_199;
  string local_198;
  string local_178;
  allocator local_151;
  string local_150;
  allocator local_129;
  string local_128;
  undefined1 local_108 [8];
  string macdir;
  string local_e0;
  char *local_c0;
  char *cfgid;
  string local_b0;
  string local_90;
  allocator local_59;
  string local_58;
  string local_38;
  cmGeneratorTarget *local_18;
  cmGeneratorTarget *this_local;
  
  local_18 = this;
  if ((GetLocationForBuild()::location_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&GetLocationForBuild()::location_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::string::string((string *)&GetLocationForBuild()::location_abi_cxx11_);
    __cxa_atexit(std::__cxx11::string::~string,&GetLocationForBuild()::location_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetLocationForBuild()::location_abi_cxx11_);
  }
  bVar1 = IsImported(this);
  if (bVar1) {
    this_00 = this->Target;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,"",&local_59);
    cmTarget::ImportedGetFullPath(&local_38,this_00,&local_58,false);
    std::__cxx11::string::operator=
              ((string *)&GetLocationForBuild()::location_abi_cxx11_,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    this_local = (cmGeneratorTarget *)std::__cxx11::string::c_str();
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b0,"",(allocator *)((long)&cfgid + 7));
    GetDirectory(&local_90,this,&local_b0,false);
    std::__cxx11::string::operator=
              ((string *)&GetLocationForBuild()::location_abi_cxx11_,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&cfgid + 7));
    this_01 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_e0,"CMAKE_CFG_INTDIR",
               (allocator *)(macdir.field_2._M_local_buf + 0xf));
    __s1 = cmMakefile::GetDefinition(this_01,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)(macdir.field_2._M_local_buf + 0xf));
    local_c0 = __s1;
    if ((__s1 != (char *)0x0) && (iVar2 = strcmp(__s1,"."), iVar2 != 0)) {
      std::__cxx11::string::operator+=((string *)&GetLocationForBuild()::location_abi_cxx11_,"/");
      std::__cxx11::string::operator+=
                ((string *)&GetLocationForBuild()::location_abi_cxx11_,local_c0);
    }
    bVar1 = IsAppBundleOnApple(this);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_128,"",&local_129);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_150,"",&local_151);
      BuildMacContentDirectory((string *)local_108,this,&local_128,&local_150,false);
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator((allocator<char> *)&local_151);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)&GetLocationForBuild()::location_abi_cxx11_,"/");
        std::__cxx11::string::operator+=
                  ((string *)&GetLocationForBuild()::location_abi_cxx11_,(string *)local_108);
      }
      std::__cxx11::string::~string((string *)local_108);
    }
    std::__cxx11::string::operator+=((string *)&GetLocationForBuild()::location_abi_cxx11_,"/");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_198,"",&local_199);
    GetFullName(&local_178,this,&local_198,false);
    std::__cxx11::string::operator+=
              ((string *)&GetLocationForBuild()::location_abi_cxx11_,(string *)&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    this_local = (cmGeneratorTarget *)std::__cxx11::string::c_str();
  }
  return (char *)this_local;
}

Assistant:

const char* cmGeneratorTarget::GetLocationForBuild() const
{
  static std::string location;
  if(this->IsImported())
    {
    location = this->Target->ImportedGetFullPath("", false);
    return location.c_str();
    }

  // Now handle the deprecated build-time configuration location.
  location = this->GetDirectory();
  const char* cfgid = this->Makefile->GetDefinition("CMAKE_CFG_INTDIR");
  if(cfgid && strcmp(cfgid, ".") != 0)
    {
    location += "/";
    location += cfgid;
    }

  if(this->IsAppBundleOnApple())
    {
    std::string macdir = this->BuildMacContentDirectory("", "",
                                                                false);
    if(!macdir.empty())
      {
      location += "/";
      location += macdir;
      }
    }
  location += "/";
  location += this->GetFullName("", false);
  return location.c_str();
}